

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::~AssertionStats(AssertionStats *this)

{
  undefined8 *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *unaff_retaddr;
  
  *in_RDI = &PTR__AssertionStats_003897a0;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
            (unaff_retaddr);
  AssertionResult::~AssertionResult((AssertionResult *)0x27d83b);
  return;
}

Assistant:

AssertionStats::~AssertionStats() = default;